

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spake2plus.cc
# Opt level: O1

bool bssl::spake2plus::anon_unknown_0::ComputeTranscript
               (uint8_t *out_prover_confirm,uint8_t *out_verifier_confirm,uint8_t *out_secret,
               uint8_t *prover_share,uint8_t *verifier_share,SHA256_CTX *sha,EC_AFFINE *Z,
               EC_AFFINE *V,EC_SCALAR *w0)

{
  bool bVar1;
  int iVar2;
  EC_GROUP *group;
  size_t sVar3;
  EVP_MD *pEVar4;
  uchar *puVar5;
  size_t sVar6;
  Span<unsigned_char> out_buf;
  uint verifier_confirm_len;
  uint prover_confirm_len;
  uint8_t *local_160;
  uint8_t *local_158;
  uint8_t *local_150;
  uint8_t keys [64];
  uint8_t K_main [32];
  uint8_t w0_enc [32];
  uint8_t V_enc [65];
  uint8_t Z_enc [65];
  
  local_160 = out_verifier_confirm;
  local_158 = out_prover_confirm;
  local_150 = out_secret;
  group = EC_group_p256();
  sVar3 = ec_point_to_bytes(group,Z,POINT_CONVERSION_UNCOMPRESSED,Z_enc,0x41);
  if (sVar3 == 0x41) {
    sVar6 = 0x41;
    sVar3 = ec_point_to_bytes(group,V,POINT_CONVERSION_UNCOMPRESSED,V_enc,0x41);
    if (sVar3 == 0x41) {
      out_buf.size_ = sVar6;
      out_buf.data_ = (uchar *)0x20;
      ScalarToSizedBuffer((anon_unknown_0 *)group,(EC_GROUP *)w0,(EC_SCALAR *)w0_enc,out_buf);
      keys[0] = 'A';
      keys[1] = '\0';
      keys[2] = '\0';
      keys[3] = '\0';
      keys[4] = '\0';
      keys[5] = '\0';
      keys[6] = '\0';
      keys[7] = '\0';
      SHA256_Update((SHA256_CTX *)sha,keys,8);
      SHA256_Update((SHA256_CTX *)sha,prover_share,0x41);
      keys[0] = 'A';
      keys[1] = '\0';
      keys[2] = '\0';
      keys[3] = '\0';
      keys[4] = '\0';
      keys[5] = '\0';
      keys[6] = '\0';
      keys[7] = '\0';
      SHA256_Update((SHA256_CTX *)sha,keys,8);
      SHA256_Update((SHA256_CTX *)sha,verifier_share,0x41);
      keys[0] = 'A';
      keys[1] = '\0';
      keys[2] = '\0';
      keys[3] = '\0';
      keys[4] = '\0';
      keys[5] = '\0';
      keys[6] = '\0';
      keys[7] = '\0';
      SHA256_Update((SHA256_CTX *)sha,keys,8);
      SHA256_Update((SHA256_CTX *)sha,Z_enc,0x41);
      keys[0] = 'A';
      keys[1] = '\0';
      keys[2] = '\0';
      keys[3] = '\0';
      keys[4] = '\0';
      keys[5] = '\0';
      keys[6] = '\0';
      keys[7] = '\0';
      SHA256_Update((SHA256_CTX *)sha,keys,8);
      SHA256_Update((SHA256_CTX *)sha,V_enc,0x41);
      keys[0] = ' ';
      keys[1] = '\0';
      keys[2] = '\0';
      keys[3] = '\0';
      keys[4] = '\0';
      keys[5] = '\0';
      keys[6] = '\0';
      keys[7] = '\0';
      SHA256_Update((SHA256_CTX *)sha,keys,8);
      SHA256_Update((SHA256_CTX *)sha,(EC_SCALAR *)w0_enc,0x20);
      SHA256_Final(K_main,(SHA256_CTX *)sha);
      pEVar4 = EVP_sha256();
      iVar2 = HKDF(keys,0x40,(EVP_MD *)pEVar4,K_main,0x20,(uint8_t *)0x0,0,
                   (uint8_t *)"ConfirmationKeys",0x10);
      if (iVar2 != 0) {
        pEVar4 = EVP_sha256();
        iVar2 = HKDF(local_150,0x20,(EVP_MD *)pEVar4,K_main,0x20,(uint8_t *)0x0,0,
                     (uint8_t *)"SharedKey",9);
        if (iVar2 != 0) {
          pEVar4 = EVP_sha256();
          puVar5 = HMAC(pEVar4,keys,0x20,verifier_share,0x41,local_158,&prover_confirm_len);
          if (puVar5 != (uchar *)0x0) {
            if (prover_confirm_len == 0x20) {
              pEVar4 = EVP_sha256();
              puVar5 = HMAC(pEVar4,keys + 0x20,0x20,prover_share,0x41,local_160,
                            &verifier_confirm_len);
              bVar1 = puVar5 != (uchar *)0x0;
              if (puVar5 == (uchar *)0x0) {
                return bVar1;
              }
              if (verifier_confirm_len == 0x20) {
                return bVar1;
              }
            }
            goto LAB_001a5665;
          }
        }
      }
      return false;
    }
  }
LAB_001a5665:
  abort();
}

Assistant:

bool ComputeTranscript(uint8_t out_prover_confirm[kConfirmSize],
                       uint8_t out_verifier_confirm[kConfirmSize],
                       uint8_t out_secret[kSecretSize],
                       const uint8_t prover_share[kShareSize],
                       const uint8_t verifier_share[kShareSize],
                       SHA256_CTX *sha, const EC_AFFINE *Z, const EC_AFFINE *V,
                       const EC_SCALAR *w0) {
  const EC_GROUP *group = EC_group_p256();

  uint8_t Z_enc[kShareSize];
  size_t Z_enc_len = ec_point_to_bytes(group, Z, POINT_CONVERSION_UNCOMPRESSED,
                                       Z_enc, sizeof(Z_enc));
  BSSL_CHECK(Z_enc_len == sizeof(Z_enc));

  uint8_t V_enc[kShareSize];
  size_t V_enc_len = ec_point_to_bytes(group, V, POINT_CONVERSION_UNCOMPRESSED,
                                       V_enc, sizeof(V_enc));
  BSSL_CHECK(V_enc_len == sizeof(V_enc));

  uint8_t w0_enc[kVerifierSize];
  ScalarToSizedBuffer(group, w0, w0_enc);

  uint8_t K_main[SHA256_DIGEST_LENGTH];
  UpdateWithLengthPrefix(sha, Span(prover_share, kShareSize));
  UpdateWithLengthPrefix(sha, Span(verifier_share, kShareSize));
  UpdateWithLengthPrefix(sha, Z_enc);
  UpdateWithLengthPrefix(sha, V_enc);
  UpdateWithLengthPrefix(sha, w0_enc);
  SHA256_Final(K_main, sha);

  auto confirmation_str = StringAsBytes("ConfirmationKeys");
  uint8_t keys[kSecretSize * 2];
  if (!HKDF(keys, sizeof(keys), EVP_sha256(), K_main, sizeof(K_main), nullptr,
            0, confirmation_str.data(), confirmation_str.size())) {
    return false;
  }

  auto secret_info_str = StringAsBytes("SharedKey");
  if (!HKDF(out_secret, kSecretSize, EVP_sha256(), K_main, sizeof(K_main),
            nullptr, 0, secret_info_str.data(), secret_info_str.size())) {
    return false;
  }

  unsigned prover_confirm_len;
  if (HMAC(EVP_sha256(), keys, kSecretSize, verifier_share, kShareSize,
           out_prover_confirm, &prover_confirm_len) == nullptr) {
    return false;
  }
  BSSL_CHECK(prover_confirm_len == kConfirmSize);

  unsigned verifier_confirm_len;
  if (HMAC(EVP_sha256(), keys + kSecretSize, kSecretSize, prover_share,
           kShareSize, out_verifier_confirm,
           &verifier_confirm_len) == nullptr) {
    return false;
  }
  BSSL_CHECK(verifier_confirm_len == kConfirmSize);

  return true;
}